

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgobs.cpp
# Opt level: O1

void init_bitmap_window(void)

{
  Am_Slot_Key AVar1;
  bool bVar2;
  ushort uVar3;
  ushort uVar4;
  char *pcVar5;
  Am_Wrapper *pAVar6;
  Am_Object *pAVar7;
  Am_Value *this;
  Am_Constraint *pAVar8;
  Am_Style *pAVar9;
  Am_Object AVar10;
  Am_Style ship_color;
  Am_Object bitmap_group;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  
  pcVar5 = (char *)Am_Merge_Pathname("images/ent.xbm");
  Am_Image_Array::Am_Image_Array((Am_Image_Array *)&local_50,pcVar5);
  Am_Image_Array::operator=((Am_Image_Array *)&SP_Federation_Image,(Am_Image_Array *)&local_50);
  Am_Image_Array::~Am_Image_Array((Am_Image_Array *)&local_50);
  pcVar5 = (char *)Am_Merge_Pathname("images/kling.xbm");
  Am_Image_Array::Am_Image_Array((Am_Image_Array *)&local_50,pcVar5);
  Am_Image_Array::operator=((Am_Image_Array *)&SP_Klingon_Image,(Am_Image_Array *)&local_50);
  Am_Image_Array::~Am_Image_Array((Am_Image_Array *)&local_50);
  Am_Object::Create((char *)&local_50);
  uVar3 = Am_Object::Set((ushort)&local_50,100,800);
  uVar3 = Am_Object::Set(uVar3,0x65,0x154);
  uVar3 = Am_Object::Set(uVar3,0x66,0x10e);
  uVar3 = Am_Object::Set(uVar3,0x67,100);
  uVar3 = Am_Object::Set(uVar3,(char *)0x6c,0x107212);
  pAVar6 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Black);
  pAVar7 = (Am_Object *)Am_Object::Set(uVar3,(Am_Wrapper *)0x6a,(ulong)pAVar6);
  Am_Object::operator=(&bitmap_window,pAVar7);
  Am_Object::~Am_Object(&local_50);
  this = (Am_Value *)Am_Object::Get(0xa048,0x87);
  bVar2 = Am_Value::operator_cast_to_bool(this);
  if (bVar2) {
    pAVar9 = (Am_Style *)&Am_Green;
  }
  else {
    pAVar9 = (Am_Style *)&Am_White;
  }
  Am_Style::Am_Style((Am_Style *)&local_50,pAVar9);
  Am_Object::Create((char *)&local_48);
  uVar3 = Am_Object::Add((ushort)&local_48,(uint)SHIP_TYPE,1);
  uVar3 = Am_Object::Set(uVar3,100,0x14);
  uVar3 = Am_Object::Set(uVar3,0x65,0x1e);
  pAVar8 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Width_Of_Parts);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x66,(ulong)pAVar8);
  pAVar8 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Height_Of_Parts);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x67,(ulong)pAVar8);
  AVar1 = BITMAP_PART;
  Am_Object::Create((char *)&local_28);
  uVar4 = Am_Object::Set((ushort)&local_28,100,0);
  uVar4 = Am_Object::Set(uVar4,0x65,0);
  pAVar8 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)ship_image);
  uVar4 = Am_Object::Set(uVar4,(Am_Constraint *)0xb0,(ulong)pAVar8);
  pAVar6 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&local_50);
  pAVar7 = (Am_Object *)Am_Object::Set(uVar4,(Am_Wrapper *)0x6b,(ulong)pAVar6);
  Am_Object::Am_Object(&local_20,pAVar7);
  AVar10.data._2_6_ = 0;
  AVar10.data._0_2_ = AVar1;
  pAVar7 = (Am_Object *)Am_Object::Add_Part(uVar3,AVar10,(ulong)&local_20);
  Am_Object::Am_Object(&local_40,pAVar7);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&local_48);
  Am_Object::Create((char *)&local_48);
  uVar3 = Am_Object::Set((ushort)&local_48,(uint)SHIP_TYPE,2);
  pAVar7 = (Am_Object *)Am_Object::Set(uVar3,100,0x96);
  Am_Object::operator=(&bitmap_group2,pAVar7);
  Am_Object::~Am_Object(&local_48);
  Am_Object::Am_Object(&local_30,&local_40);
  Am_Object::Add_Part((Am_Object)0x1092c0,SUB81(&local_30,0),1);
  Am_Object::~Am_Object(&local_30);
  Am_Object::Am_Object(&local_38,&bitmap_group2);
  Am_Object::Add_Part((Am_Object)0x1092c0,SUB81(&local_38,0),1);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_40);
  Am_Style::~Am_Style((Am_Style *)&local_50);
  return;
}

Assistant:

void
init_bitmap_window()
{

  // Can't call Am_Merge_Pathname until after Am_Initialize();
  SP_Federation_Image = Am_Image_Array(Am_Merge_Pathname(IMFN_FEDERATION));
  SP_Klingon_Image = Am_Image_Array(Am_Merge_Pathname(IMFN_KLINGON));

  bitmap_window = Am_Window.Create("bitmap_window")
                      .Set(Am_LEFT, 800)
                      .Set(Am_TOP, 340)
                      .Set(Am_WIDTH, 270)
                      .Set(Am_HEIGHT, 100)
                      .Set(Am_TITLE, "Testing Opal Bitmaps")
                      .Set(Am_FILL_STYLE, Am_Black);

  bool color = Am_Screen.Get(Am_IS_COLOR);
  Am_Style ship_color = color ? Am_Green : Am_White;

  Am_Object bitmap_group =
      Am_Group.Create("bitmap_group")
          .Add(SHIP_TYPE, FEDERATION)
          .Set(Am_LEFT, 20)
          .Set(Am_TOP, 30)
          .Set(Am_WIDTH, Am_Width_Of_Parts)
          .Set(Am_HEIGHT, Am_Height_Of_Parts)
          .Add_Part(BITMAP_PART, Am_Bitmap.Create("bitmap1")
                                     .Set(Am_LEFT, 0)
                                     .Set(Am_TOP, 0)
                                     .Set(Am_IMAGE, ship_image)
                                     .Set(Am_LINE_STYLE, ship_color));

  bitmap_group2 = bitmap_group.Create("bitmap_group2")
                      .Set(SHIP_TYPE, KLINGON)
                      .Set(Am_LEFT, 150);

  bitmap_window.Add_Part(bitmap_group);
  bitmap_window.Add_Part(bitmap_group2);
}